

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O2

uint32_t AddToken(VP8TBuffer *b,uint32_t bit,uint32_t proba_idx,proba_t *stats)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = b->left_;
  if (iVar2 < 1) {
    iVar2 = TBufferNewPage(b);
    if (iVar2 == 0) goto LAB_00131dd5;
    iVar2 = b->left_;
  }
  b->left_ = iVar2 + -1;
  b->tokens_[(long)iVar2 + -1] = (ushort)(bit << 0xf) | (ushort)proba_idx;
LAB_00131dd5:
  uVar1 = *stats;
  uVar3 = uVar1 + 1 >> 1 & 0x7fff7fff;
  if (uVar1 < 0xfffe0000) {
    uVar3 = uVar1;
  }
  *stats = bit + uVar3 + 0x10000;
  return bit;
}

Assistant:

static WEBP_INLINE uint32_t AddToken(VP8TBuffer* const b, uint32_t bit,
                                     uint32_t proba_idx,
                                     proba_t* const stats) {
  assert(proba_idx < FIXED_PROBA_BIT);
  assert(bit <= 1);
  if (b->left_ > 0 || TBufferNewPage(b)) {
    const int slot = --b->left_;
    b->tokens_[slot] = (bit << 15) | proba_idx;
  }
  VP8RecordStats(bit, stats);
  return bit;
}